

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O2

void Saig_ManCbaUnrollCollect_rec
               (Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Int_t *vObjs,Vec_Int_t *vRoots)

{
  Vec_Ptr_t *p;
  uint uVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  long lStack_40;
  
  if (pObj->TravId == pAig->nTravIds) {
    return;
  }
  pObj->TravId = pAig->nTravIds;
  uVar1 = (uint)*(undefined8 *)&pObj->field_0x18;
  if ((uVar1 & 7) == 3) {
    lStack_40 = 8;
  }
  else {
    if ((uVar1 & 7) - 7 < 0xfffffffe) goto LAB_004f1efc;
    Saig_ManCbaUnrollCollect_rec
              (pAig,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vObjs,vRoots);
    lStack_40 = 0x10;
  }
  Saig_ManCbaUnrollCollect_rec
            (pAig,(Aig_Obj_t *)(*(ulong *)((long)&pObj->field_0 + lStack_40) & 0xfffffffffffffffe),
             vObjs,vRoots);
LAB_004f1efc:
  if (vRoots != (Vec_Int_t *)0x0) {
    iVar2 = Saig_ObjIsLo(pAig,pObj);
    if (iVar2 != 0) {
      iVar2 = Saig_ObjIsLo(pAig,pObj);
      if (iVar2 == 0) {
        __assert_fail("Saig_ObjIsLo(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                      ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
      }
      p = pAig->vCos;
      iVar2 = pAig->nTruePos;
      iVar3 = Aig_ObjCioId(pObj);
      pvVar4 = Vec_PtrEntry(p,(iVar2 + iVar3) - pAig->nTruePis);
      Vec_IntPush(vRoots,*(int *)((long)pvVar4 + 0x24));
    }
  }
  Vec_IntPush(vObjs,pObj->Id);
  return;
}

Assistant:

void Saig_ManCbaUnrollCollect_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Int_t * vObjs, Vec_Int_t * vRoots )
{
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    if ( Aig_ObjIsCo(pObj) )
        Saig_ManCbaUnrollCollect_rec( pAig, Aig_ObjFanin0(pObj), vObjs, vRoots );
    else if ( Aig_ObjIsNode(pObj) )
    {
        Saig_ManCbaUnrollCollect_rec( pAig, Aig_ObjFanin0(pObj), vObjs, vRoots );
        Saig_ManCbaUnrollCollect_rec( pAig, Aig_ObjFanin1(pObj), vObjs, vRoots );
    }
    if ( vRoots && Saig_ObjIsLo( pAig, pObj ) )
        Vec_IntPush( vRoots, Aig_ObjId( Saig_ObjLoToLi(pAig, pObj) ) );
    Vec_IntPush( vObjs, Aig_ObjId(pObj) );
}